

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

StringRef __thiscall
anon_unknown.dwarf_1cebf9::normaliseOpt(anon_unknown_dwarf_1cebf9 *this,StringRef optName)

{
  char *pcVar1;
  char *pcVar2;
  StringRef SVar3;
  
  pcVar2 = optName.m_start;
  pcVar1 = pcVar2;
  if (*this == (anon_unknown_dwarf_1cebf9)0x2d) {
    this = this + 1;
    pcVar1 = pcVar2 + -1;
    if (pcVar2 <= pcVar2 + -1) {
      pcVar1 = pcVar2;
    }
    if (pcVar2 < (char *)0x2) {
      this = (anon_unknown_dwarf_1cebf9 *)0x16cde1;
      pcVar1 = (char *)0x0;
    }
  }
  SVar3.m_size = (size_type)pcVar1;
  SVar3.m_start = (char *)this;
  return SVar3;
}

Assistant:

Catch::StringRef normaliseOpt( Catch::StringRef optName ) {
        if ( optName[0] == '-'
#if defined(CATCH_PLATFORM_WINDOWS)
             || optName[0] == '/'
#endif
        ) {
            return optName.substr( 1, optName.size() );
        }

        return optName;
    }